

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_boolean_test.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::TransformBooleanTestIsNull
          (duckdb *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *argument,ExpressionType operator_type,int query_location)

{
  OperatorExpression *this_00;
  type expr;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_40;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_38;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_30;
  
  this_00 = (OperatorExpression *)operator_new(0x50);
  local_30._M_head_impl =
       (argument->
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (argument->
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  local_40._M_head_impl = (ParsedExpression *)0x0;
  OperatorExpression::OperatorExpression
            (this_00,operator_type,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_30,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_40);
  local_38._M_head_impl = (ParsedExpression *)this_00;
  if (local_40._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_40._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_40._M_head_impl = (ParsedExpression *)0x0;
  if (local_30._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_30._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  expr = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
         ::operator*((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                      *)&local_38);
  Transformer::SetQueryLocation(&expr->super_ParsedExpression,query_location);
  *(ParsedExpression **)this = local_38._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )local_38._M_head_impl;
}

Assistant:

static unique_ptr<ParsedExpression> TransformBooleanTestIsNull(unique_ptr<ParsedExpression> argument,
                                                               ExpressionType operator_type, int query_location) {
	auto result = make_uniq<OperatorExpression>(operator_type, std::move(argument));
	Transformer::SetQueryLocation(*result, query_location);
	return std::move(result);
}